

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O2

void reoProfileWidthStart(reo_man *p)

{
  size_t __size;
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  reo_unit *prVar4;
  reo_unit *prVar5;
  int *__ptr;
  int *__ptr_00;
  long lVar6;
  ulong uVar7;
  reo_plane *prVar8;
  reo_unit **pprVar9;
  ulong uVar10;
  short *psVar11;
  uint uVar12;
  long lVar13;
  
  uVar12 = p->nSupp;
  __size = (long)(int)uVar12 * 4 + 4;
  __ptr = (int *)calloc(1,__size);
  __ptr_00 = (int *)calloc(1,__size);
  for (lVar6 = 0; lVar6 <= (int)uVar12; lVar6 = lVar6 + 1) {
    pprVar9 = &p->pPlanes[lVar6].pHead;
    while (prVar4 = *pprVar9, prVar4 != (reo_unit *)0x0) {
      prVar4->TopRef = 30000;
      prVar4->Sign = 0;
      pprVar9 = &prVar4->Next;
    }
  }
  uVar10 = 0;
  uVar7 = (ulong)(uint)p->nTops;
  if (p->nTops < 1) {
    uVar7 = uVar10;
  }
  for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    psVar11 = (short *)((ulong)p->pTops[uVar10] & 0xfffffffffffffffe);
    if (psVar11[1] == 30000) {
      psVar11[1] = 0;
      *__ptr = *__ptr + 1;
      if ((long)*psVar11 != 30000) {
        __ptr_00[(long)*psVar11 + 1] = __ptr_00[(long)*psVar11 + 1] + 1;
      }
    }
  }
  uVar7 = 0;
  uVar10 = 0;
  if (0 < (int)uVar12) {
    uVar10 = (ulong)uVar12;
  }
  for (; uVar7 != uVar10; uVar7 = uVar7 + 1) {
    pprVar9 = &p->pPlanes[uVar7].pHead;
    while (prVar4 = *pprVar9, prVar4 != (reo_unit *)0x0) {
      prVar5 = prVar4->pE;
      if (prVar5->TopRef == 30000) {
        uVar1 = prVar4->lev;
        prVar5->TopRef = uVar1 + 1;
        __ptr[(short)(uVar1 + 1)] = __ptr[(short)(uVar1 + 1)] + 1;
        if ((long)prVar5->lev != 30000) {
          __ptr_00[(long)prVar5->lev + 1] = __ptr_00[(long)prVar5->lev + 1] + 1;
        }
      }
      prVar5 = prVar4->pT;
      if (prVar5->TopRef == 30000) {
        uVar2 = prVar4->lev;
        prVar5->TopRef = uVar2 + 1;
        __ptr[(short)(uVar2 + 1)] = __ptr[(short)(uVar2 + 1)] + 1;
        if ((long)prVar5->lev != 30000) {
          __ptr_00[(long)prVar5->lev + 1] = __ptr_00[(long)prVar5->lev + 1] + 1;
        }
      }
      pprVar9 = &prVar4->Next;
    }
  }
  lVar13 = 0;
  for (lVar6 = 0; lVar6 < (int)uVar12; lVar6 = lVar6 + 1) {
    reoProfileWidthVerifyLevel((reo_plane *)((long)&p->pPlanes->fSifted + lVar13),(int)lVar6);
    uVar12 = p->nSupp;
    lVar13 = lVar13 + 0x38;
  }
  p->nWidthCur = 0;
  lVar6 = 0;
  for (uVar7 = 0; (long)uVar7 <= (long)(int)uVar12; uVar7 = uVar7 + 1) {
    if (lVar6 == 0) {
      prVar8 = p->pPlanes;
      prVar8->statsWidth = *__ptr - *__ptr_00;
    }
    else {
      prVar8 = p->pPlanes;
      *(int *)((long)&prVar8->statsWidth + lVar6) =
           (__ptr[uVar7] + *(int *)((long)prVar8 + lVar6 + -0x30)) - __ptr_00[uVar7];
    }
    iVar3 = *(int *)((long)&prVar8->statsWidth + lVar6);
    *(double *)((long)&prVar8->statsCost + lVar6) = (double)iVar3;
    p->nWidthCur = p->nWidthCur + iVar3;
    printf("Level %2d: Width = %5d.\n",uVar7 & 0xffffffff);
    uVar12 = p->nSupp;
    lVar6 = lVar6 + 0x38;
  }
  p->nWidthBeg = p->nWidthCur;
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void reoProfileWidthStart( reo_man * p )
{
    reo_unit * pUnit;
    int * pWidthStart;
    int * pWidthStop;
    int v;

    // allocate and clean the storage for starting and stopping levels
    pWidthStart = ABC_ALLOC( int, p->nSupp + 1 );
    pWidthStop  = ABC_ALLOC( int, p->nSupp + 1 );
    memset( pWidthStart, 0, sizeof(int) * (p->nSupp + 1) );
    memset( pWidthStop, 0, sizeof(int) * (p->nSupp + 1) );

    // go through the non-constant nodes and set the topmost level of their cofactors
    for ( v = 0; v <= p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        pUnit->TopRef = REO_TOPREF_UNDEF;
        pUnit->Sign   = 0;
    }

    // add the topmost level of the width profile
    for ( v = 0; v < p->nTops; v++ )
    {
        pUnit = Unit_Regular(p->pTops[v]);
        if ( pUnit->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->TopRef = 0;
            pWidthStart[pUnit->TopRef]++;
            // set the stopping level
            if ( pUnit->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->lev+1]++;
        }
    }

    for ( v = 0; v < p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        if ( pUnit->pE->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->pE->TopRef = pUnit->lev + 1;
            pWidthStart[pUnit->pE->TopRef]++;
            // set the stopping level
            if ( pUnit->pE->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->pE->lev+1]++;
        }
        if ( pUnit->pT->TopRef == REO_TOPREF_UNDEF )
        {
            // set the starting level
            pUnit->pT->TopRef = pUnit->lev + 1;
            pWidthStart[pUnit->pT->TopRef]++;
            // set the stopping level
            if ( pUnit->pT->lev != REO_CONST_LEVEL )
                pWidthStop[pUnit->pT->lev+1]++;
        }
    }

    // verify the top reference
    for ( v = 0; v < p->nSupp; v++ )
        reoProfileWidthVerifyLevel( p->pPlanes + v, v );

    // derive the profile
    p->nWidthCur = 0;
    for ( v = 0; v <= p->nSupp; v++ )
    {
        if ( v == 0 )
            p->pPlanes[v].statsWidth = pWidthStart[v] - pWidthStop[v];
        else
            p->pPlanes[v].statsWidth = p->pPlanes[v-1].statsWidth + pWidthStart[v] - pWidthStop[v];
        p->pPlanes[v].statsCost = p->pPlanes[v].statsWidth;
        p->nWidthCur += p->pPlanes[v].statsWidth;
        printf( "Level %2d: Width = %5d.\n", v, p->pPlanes[v].statsWidth );
    }
    p->nWidthBeg = p->nWidthCur;
    ABC_FREE( pWidthStart );
    ABC_FREE( pWidthStop );
}